

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O2

bool sf::priv::InputImpl::isMouseButtonPressed(Button button)

{
  bool bVar1;
  Display *display;
  uint buttons;
  int gy;
  int gx;
  int wy;
  int wx;
  Window child;
  Window root;
  
  display = OpenDisplay();
  buttons = 0;
  XQueryPointer(display,*(undefined8 *)
                         (*(long *)(display + 0xe8) + 0x10 + (long)*(int *)(display + 0xe0) * 0x80),
                &root,&child,&gx,&gy,&wx,&wy,&buttons);
  CloseDisplay(display);
  if (button == Middle) {
    bVar1 = (bool)((buttons._1_1_ & 2) >> 1);
  }
  else if (button == Right) {
    bVar1 = (bool)((buttons._1_1_ & 4) >> 2);
  }
  else if (button == Left) {
    bVar1 = (bool)(buttons._1_1_ & 1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool InputImpl::isMouseButtonPressed(Mouse::Button button)
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    // we don't care about these but they are required
    ::Window root, child;
    int wx, wy;
    int gx, gy;

    unsigned int buttons = 0;
    XQueryPointer(display, DefaultRootWindow(display), &root, &child, &gx, &gy, &wx, &wy, &buttons);

    // Close the connection with the X server
    CloseDisplay(display);

    // Buttons 4 and 5 are the vertical wheel and 6 and 7 the horizontal wheel.
    // There is no mask for buttons 8 and 9, so checking the state of buttons
    // Mouse::XButton1 and Mouse::XButton2 is not supported.
    switch (button)
    {
        case Mouse::Left:     return buttons & Button1Mask;
        case Mouse::Right:    return buttons & Button3Mask;
        case Mouse::Middle:   return buttons & Button2Mask;
        case Mouse::XButton1: return false; // not supported by X
        case Mouse::XButton2: return false; // not supported by X
        default:              return false;
    }

    return false;
}